

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O2

ErrCode __thiscall HttpHeaderBase::removeField(HttpHeaderBase *this,FieldType type)

{
  char *pcVar1;
  undefined4 uVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  HeaderField *pHVar6;
  int iVar7;
  ulong uVar9;
  uint uVar8;
  
  uVar8 = this->mNumFields;
  lVar3 = (long)(int)uVar8;
  uVar4 = 0;
  uVar9 = 0;
  if (0 < (int)uVar8) {
    uVar9 = (ulong)uVar8;
  }
  pHVar6 = this->mFields;
  for (; pHVar6 = pHVar6 + 1, uVar9 != uVar4; uVar4 = uVar4 + 1) {
    uVar5 = uVar4;
    if (pHVar6[-1].mType == type) goto LAB_00119f97;
  }
LAB_00119fcf:
  return (ErrCode)(lVar3 <= (long)uVar4);
LAB_00119f97:
  while( true ) {
    iVar7 = uVar8 - 1;
    if ((long)iVar7 <= (long)uVar5) break;
    uVar2 = *(undefined4 *)&pHVar6->field_0x4;
    pcVar1 = pHVar6->mData;
    pHVar6[-1].mType = pHVar6->mType;
    *(undefined4 *)&pHVar6[-1].field_0x4 = uVar2;
    pHVar6[-1].mData = pcVar1;
    uVar8 = this->mNumFields;
    pHVar6 = pHVar6 + 1;
    uVar5 = uVar5 + 1;
  }
  this->mFields[iVar7].mData = (char *)0x0;
  this->mNumFields = iVar7;
  goto LAB_00119fcf;
}

Assistant:

ErrCode HttpHeaderBase::removeField(FieldMap::FieldType type)
{
	TRACE_BEGIN(LOG_LVL_NOISE);

	for (int i = 0; i < mNumFields; i++)
	{
		if (mFields[i].mType == type)
		{
			for (int j = i; j < mNumFields - 1; j++)
			{
				mFields[j] = mFields[j + 1];
			}
			mFields[mNumFields - 1].mData = NULL;
			mNumFields--;
			return JetHead::kNoError;
		}
	}
	return JetHead::kNotFound;
}